

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int unixCurrentTime(sqlite3_vfs *NotUsed,double *prNow)

{
  long in_FS_OFFSET;
  sqlite3_int64 i;
  sqlite3_int64 local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = 0;
  unixCurrentTimeInt64(NotUsed,&local_20);
  *prNow = (double)local_20 / 86400000.0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

static int unixCurrentTime(sqlite3_vfs *NotUsed, double *prNow){
  sqlite3_int64 i = 0;
  int rc;
  UNUSED_PARAMETER(NotUsed);
  rc = unixCurrentTimeInt64(0, &i);
  *prNow = i/86400000.0;
  return rc;
}